

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O3

uint32_t VP8LReadBits(VP8LBitReader *br,int n_bits)

{
  uint32_t uVar1;
  
  if ((n_bits < 0x19) && (br->eos_ == 0)) {
    uVar1 = (uint)(br->val_ >> ((byte)br->bit_pos_ & 0x3f)) & kBitMask[n_bits];
    br->bit_pos_ = br->bit_pos_ + n_bits;
    ShiftBytes(br);
  }
  else {
    br->bit_pos_ = 0;
    br->eos_ = 1;
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

uint32_t VP8LReadBits(VP8LBitReader* const br, int n_bits) {
  assert(n_bits >= 0);
  // Flag an error if end_of_stream or n_bits is more than allowed limit.
  if (!br->eos_ && n_bits <= VP8L_MAX_NUM_BIT_READ) {
    const uint32_t val = VP8LPrefetchBits(br) & kBitMask[n_bits];
    const int new_bits = br->bit_pos_ + n_bits;
    br->bit_pos_ = new_bits;
    ShiftBytes(br);
    return val;
  } else {
    VP8LSetEndOfStream(br);
    return 0;
  }
}